

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

string * toHexStr_abi_cxx11_(string *__return_storage_ptr__,Argument_t *arg,uint8_t bytes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  undefined7 in_register_00000011;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,bytes) != 0) {
    toHexStr_abi_cxx11_(&local_70,arg->at1);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p)
    ;
    paVar1 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (bytes != '\x01') {
      toHexStr_abi_cxx11_(&local_50,arg->at2);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x107961);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_70.field_2._M_allocated_capacity = *psVar3;
        local_70.field_2._8_8_ = plVar2[3];
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar3;
        local_70._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_70._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (2 < bytes) {
        toHexStr_abi_cxx11_(&local_50,arg->at3);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x107961);
        psVar3 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_70.field_2._M_allocated_capacity = *psVar3;
          local_70.field_2._8_8_ = plVar2[3];
          local_70._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar3;
          local_70._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_70._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toHexStr(const Instruction::Argument_t &arg, uint8_t bytes) {
    std::string s;

    if(bytes >= 1) {
        s += toHexStr(arg.at1);
    }
    if(bytes >= 2) {
        s += " " + toHexStr(arg.at2);
    }
    if(bytes >= 3) {
        s += " " + toHexStr(arg.at3);
    }

    return s;
}